

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O0

_Bool ggml_graph_compute_thread_ready(ggml_compute_state *state)

{
  int iVar1;
  ggml_threadpool *pgVar2;
  _Bool _Var3;
  ggml_compute_state *in_RDI;
  int new_graph;
  ggml_threadpool *threadpool;
  _Bool local_1;
  
  pgVar2 = in_RDI->threadpool;
  if ((((in_RDI->pending & 1U) == 0) && ((pgVar2->stop & 1U) == 0)) && ((pgVar2->pause & 1U) == 0))
  {
    iVar1 = pgVar2->n_graph;
    if (iVar1 != in_RDI->last_graph) {
      _Var3 = ggml_graph_compute_thread_active(in_RDI);
      in_RDI->pending = _Var3;
      in_RDI->last_graph = iVar1;
    }
    local_1 = (_Bool)(in_RDI->pending & 1);
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

static inline bool ggml_graph_compute_thread_ready(struct ggml_compute_state * state) {
    struct ggml_threadpool * threadpool = state->threadpool;

    if (state->pending || threadpool->stop || threadpool->pause) { return true; }

    // check for new graph/work
    int new_graph = atomic_load_explicit(&threadpool->n_graph, memory_order_relaxed);
    if (new_graph != state->last_graph) {
        state->pending    = ggml_graph_compute_thread_active(state);
        state->last_graph = new_graph;
    }

    return state->pending;
}